

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

double QualityToCompression(double c)

{
  double in_XMM0_Qa;
  double dVar1;
  double v;
  double linear_c;
  undefined8 local_20;
  
  if (0.75 <= in_XMM0_Qa) {
    local_20 = in_XMM0_Qa + in_XMM0_Qa + -1.0;
  }
  else {
    local_20 = in_XMM0_Qa * 0.6666666666666666;
  }
  dVar1 = pow(local_20,0.3333333333333333);
  return dVar1;
}

Assistant:

static double QualityToCompression(double c) {
  const double linear_c = (c < 0.75) ? c * (2. / 3.) : 2. * c - 1.;
  // The file size roughly scales as pow(quantizer, 3.). Actually, the
  // exponent is somewhere between 2.8 and 3.2, but we're mostly interested
  // in the mid-quant range. So we scale the compressibility inversely to
  // this power-law: quant ~= compression ^ 1/3. This law holds well for
  // low quant. Finer modeling for high-quant would make use of kAcTable[]
  // more explicitly.
  const double v = pow(linear_c, 1 / 3.);
  return v;
}